

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_test.cpp
# Opt level: O3

void flatbuffers::tests::anon_unknown_1::NumericUtilsTestFloat<float>(char *lower,char *upper)

{
  bool expval;
  bool bVar1;
  char *end;
  float local_3c;
  char *local_38;
  
  local_38 = "";
  strtof_l("",&local_38,ClassicLocale::instance_);
  if (local_38 == "") {
    bVar1 = false;
  }
  else {
    bVar1 = *local_38 == '\0';
  }
  expval = false;
  TestEq<bool,bool>(bVar1,false,"\'flatbuffers::StringToNumber(\"\", &f)\' != \'false\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                    ,0x1b,"");
  local_38 = "1q";
  local_3c = strtof_l("1q",&local_38,ClassicLocale::instance_);
  if (local_38 == "1q") {
    local_3c = 0.0;
  }
  else if (*local_38 == '\0') {
    expval = true;
    if (NAN(local_3c)) {
      local_3c = NAN;
    }
  }
  else {
    local_3c = 0.0;
    expval = false;
  }
  TestEq<bool,bool>(expval,false,"\'flatbuffers::StringToNumber(\"1q\", &f)\' != \'false\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                    ,0x1c,"");
  TestEq<float,int>(local_3c,0,"\'f\' != \'0\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                    ,0x1d,"");
  if (upper != (char *)0x0) {
    local_38 = upper;
    local_3c = strtof_l(upper,&local_38,ClassicLocale::instance_);
    if ((local_38 == upper) || (*local_38 != '\0')) {
      local_3c = 0.0;
      bVar1 = false;
    }
    else {
      bVar1 = true;
      if (NAN(local_3c)) {
        local_3c = NAN;
      }
    }
    TestEq<bool,bool>(bVar1,true,"\'flatbuffers::StringToNumber(upper, &f)\' != \'true\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                      ,0x1e,"");
    TestEq<float,float>(local_3c,INFINITY,"\'f\' != \'+flatbuffers::numeric_limits<T>::infinity()\'"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                        ,0x1f,"");
    if (lower != (char *)0x0) {
      local_38 = lower;
      local_3c = strtof_l(lower,&local_38,ClassicLocale::instance_);
      if ((local_38 == lower) || (*local_38 != '\0')) {
        local_3c = 0.0;
        bVar1 = false;
      }
      else {
        bVar1 = true;
        if (NAN(local_3c)) {
          local_3c = NAN;
        }
      }
      TestEq<bool,bool>(bVar1,true,"\'flatbuffers::StringToNumber(lower, &f)\' != \'true\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                        ,0x20,"");
      TestEq<float,float>(local_3c,-INFINITY,
                          "\'f\' != \'-flatbuffers::numeric_limits<T>::infinity()\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                          ,0x21,"");
      return;
    }
  }
  __assert_fail("str && val",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/util.h"
                ,0x138,"bool flatbuffers::StringToFloatImpl(T *, const char *const) [T = float]");
}

Assistant:

void NumericUtilsTestFloat(const char *lower, const char *upper) {
  T f;
  TEST_EQ(flatbuffers::StringToNumber("", &f), false);
  TEST_EQ(flatbuffers::StringToNumber("1q", &f), false);
  TEST_EQ(f, 0);
  TEST_EQ(flatbuffers::StringToNumber(upper, &f), true);
  TEST_EQ(f, +flatbuffers::numeric_limits<T>::infinity());
  TEST_EQ(flatbuffers::StringToNumber(lower, &f), true);
  TEST_EQ(f, -flatbuffers::numeric_limits<T>::infinity());
}